

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::Own<const_kj::Directory>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryOpenSubdir
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  Impl *this_00;
  uint uVar1;
  _func_int **pp_Var2;
  ArrayDisposer **ppAVar3;
  Disposer DVar4;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> ctx;
  size_t sVar5;
  WriteMode mode_00;
  undefined4 in_register_0000000c;
  long lVar6;
  Directory *pDVar7;
  Directory *extraout_RDX;
  Directory *extraout_RDX_00;
  _func_int **pp_Var8;
  Directory *extraout_RDX_01;
  Directory *extraout_RDX_02;
  void *in_R8;
  void *__arg;
  Maybe<kj::Own<const_kj::Directory>_> MVar9;
  StringPtr name;
  StringPtr name_00;
  PathPtr path_00;
  Fault f;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  FsNode local_48;
  Disposer DStack_40;
  void *__child_stack;
  
  lVar6 = CONCAT44(in_register_0000000c,mode);
  pDVar7 = (Directory *)path.parts.size_;
  name_00.content.ptr = path.parts.ptr;
  if (lVar6 == 1) {
    __arg = in_R8;
    kj::_::Mutex::lock((Mutex *)(name_00.content.ptr + 1),EXCLUSIVE);
    this_00 = (Impl *)(name_00.content.ptr + 2);
    pp_Var2 = pDVar7[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
    if (pp_Var2 == (_func_int **)0x0) {
      pp_Var8 = (_func_int **)0x514074;
    }
    else {
      pp_Var8 = (pDVar7->super_ReadableDirectory).super_FsNode._vptr_FsNode;
    }
    name.content.size_ = (long)pp_Var2 + (ulong)(pp_Var2 == (_func_int **)0x0);
    name.content.ptr = (char *)pp_Var8;
    mode_00 = (WriteMode)in_R8;
    local_68._16_8_ = (Mutex *)(name_00.content.ptr + 1);
    local_68._24_8_ = this_00;
    ctx = Impl::openEntry(this_00,name,mode_00);
    if (ctx.ptr == (EntryImpl *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      uVar1 = ((ctx.ptr)->node).tag;
      if (uVar1 == 0) {
        if (((ulong)in_R8 & 1) == 0) {
          kj::_::Debug::Fault::Fault
                    ((Fault *)local_88,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x672,FAILED,"has(mode, WriteMode::CREATE)","");
          kj::_::Debug::Fault::fatal((Fault *)local_88);
        }
        sVar5 = (*(code *)**(undefined8 **)this_00->clock)();
        name_00.content.ptr[4].content.size_ = sVar5;
        newInMemoryDirectory((kj *)local_68,(Clock *)name_00.content.ptr[2].content.ptr);
        local_48._vptr_FsNode = (_func_int **)local_68._0_8_;
        DStack_40._vptr_Disposer = (_func_int **)local_68._8_8_;
        local_68._8_8_ = (InMemoryDirectory *)0x0;
        EntryImpl::init((EntryImpl *)local_88,(EVP_PKEY_CTX *)ctx.ptr);
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)local_88._0_8_;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_88._8_8_;
        local_88._8_8_ = (InMemoryDirectory *)0x0;
        Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)local_88);
        Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)&stack0xffffffffffffffb8);
        Own<kj::Directory>::dispose((Own<kj::Directory> *)local_68);
      }
      else if (uVar1 == 3) {
        SymlinkNode::parse((Path *)local_88,(SymlinkNode *)&((ctx.ptr)->node).field_1);
        Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::release
                  ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)(local_68 + 0x10));
        path_00.parts.size_ = local_88._0_8_;
        path_00.parts.ptr = name_00.content.ptr;
        tryOpenSubdir(this,path_00,(WriteMode)local_88._8_8_);
        Array<kj::String>::~Array((Array<kj::String> *)local_88);
      }
      else if (uVar1 == 2) {
        Directory::clone((Directory *)local_88,*(__fn **)((long)&((ctx.ptr)->node).field_1 + 8),
                         __child_stack,mode_00,__arg);
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)local_88._0_8_;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_88._8_8_;
        local_88._8_8_ = (InMemoryDirectory *)0x0;
        Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)local_88);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
                  ((Fault *)local_88,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x676,FAILED,(char *)0x0,"\"not a directory\"",(char (*) [16])0x57d72c);
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        kj::_::Debug::Fault::~Fault((Fault *)local_88);
      }
    }
    Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)(local_68 + 0x10));
    pDVar7 = extraout_RDX_02;
  }
  else if (lVar6 == 0) {
    if (((ulong)in_R8 & 2) == 0) {
      if (((ulong)in_R8 & 1) == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                  ((Fault *)local_88,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x495,FAILED,(char *)0x0,"\"can\'t replace self\"",
                   (char (*) [19])"can\'t replace self");
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        kj::_::Debug::Fault::~Fault((Fault *)local_88);
        pDVar7 = extraout_RDX;
      }
      else {
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      }
    }
    else {
      LOCK();
      ppAVar3 = &((name_00.content.ptr)->content).disposer;
      *(int *)ppAVar3 = *(int *)ppAVar3 + 1;
      UNLOCK();
      local_88._0_8_ = &((name_00.content.ptr)->content).size_;
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)local_88._0_8_;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer =
           (_func_int **)name_00.content.ptr;
      local_88._8_8_ = (InMemoryDirectory *)0x0;
      Own<const_kj::(anonymous_namespace)::InMemoryDirectory>::~Own
                ((Own<const_kj::(anonymous_namespace)::InMemoryDirectory> *)local_88);
      pDVar7 = extraout_RDX_00;
    }
  }
  else {
    pp_Var2 = pDVar7[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
    if (pp_Var2 == (_func_int **)0x0) {
      pp_Var8 = (_func_int **)0x514074;
    }
    else {
      pp_Var8 = (pDVar7->super_ReadableDirectory).super_FsNode._vptr_FsNode;
    }
    name_00.content.size_ = (size_t)pp_Var8;
    tryGetParent((InMemoryDirectory *)&stack0xffffffffffffffb8,name_00,
                 (int)pp_Var2 + (uint)(pp_Var2 == (_func_int **)0x0));
    DVar4._vptr_Disposer = DStack_40._vptr_Disposer;
    local_88._0_8_ = local_48._vptr_FsNode;
    local_88._8_8_ = DStack_40._vptr_Disposer;
    DStack_40._vptr_Disposer = (_func_int **)0x0;
    Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)&stack0xffffffffffffffb8);
    if ((InMemoryDirectory *)DVar4._vptr_Disposer == (InMemoryDirectory *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)(*DVar4._vptr_Disposer + 0x88))
                (this,DVar4._vptr_Disposer,pDVar7 + 3,lVar6 + -1,(ulong)in_R8 & 0xffffffff);
    }
    Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)local_88);
    pDVar7 = extraout_RDX_01;
  }
  MVar9.ptr.ptr = pDVar7;
  MVar9.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory>_>)MVar9.ptr;
}

Assistant:

Maybe<Own<const Directory>> tryOpenSubdir(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        return atomicAddRef(*this);
      } else if (has(mode, WriteMode::CREATE)) {
        return nullptr;  // already exists
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return nullptr; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(path[0], mode)) {
        return asDirectory(lock, *entry, mode);
      } else {
        return nullptr;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->tryOpenSubdir(path.slice(1, path.size()), mode);
      } else {
        return nullptr;
      }
    }
  }